

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioCfgInternals(uint cfgWhat,uint cfgVal)

{
  uint uVar1;
  FILE *__stream;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: cfgWhat=%u, cfgVal=%d\n",myTimeStamp::buf,"gpioCfgInternals",cfgWhat,
            cfgVal);
  }
  if (cfgWhat == 0x3ab249ff) {
    if (8 < cfgVal) {
      return -0x22;
    }
    gpioCfg.internals = gpioCfg.internals & 0xfffffff0 | cfgVal;
    uVar1 = gpioCfg.internals >> 10 & 1;
    gpioCfg.dbgLevel = cfgVal;
  }
  else {
    if (cfgWhat != 0x2186d6f1) {
      return -0x22;
    }
    uVar1 = gpioCfg.internals & 0x400;
    gpioCfg.internals = (uint)(cfgVal != 0) << 9 | gpioCfg.internals & 0xfffffdff;
  }
  if (uVar1 == 0) {
    gpioCfgInternals_cold_1();
  }
  return 0;
}

Assistant:

int gpioCfgInternals(unsigned cfgWhat, unsigned cfgVal)
{
   int retVal = PI_BAD_CFG_INTERNAL;

   DBG(DBG_USER, "cfgWhat=%u, cfgVal=%d", cfgWhat, cfgVal);

   switch(cfgWhat)
   {
      case 562484977:

         if (cfgVal) gpioCfg.internals |= PI_CFG_STATS;
         else gpioCfg.internals &= (~PI_CFG_STATS);

         DBG(DBG_ALWAYS, "show stats is %u", cfgVal);

         retVal = 0;

         break;

      case 984762879:

         if ((cfgVal >= DBG_ALWAYS) && (cfgVal <= DBG_MAX_LEVEL))
         {
            
            gpioCfg.dbgLevel = cfgVal;
            gpioCfg.internals = (gpioCfg.internals & (~0xF)) | cfgVal;

            DBG(DBG_ALWAYS, "Debug level is %u", cfgVal);

            retVal = 0;
         }

         break;
   }

   return retVal;
}